

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<vkb::detail::SurfaceSupportDetails> *
vkb::detail::query_surface_support_details(VkPhysicalDevice phys_device,VkSurfaceKHR surface)

{
  uint32_t uVar1;
  VkResult VVar2;
  long in_RDX;
  Result<vkb::detail::SurfaceSupportDetails> *in_RDI;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> formats;
  VkSurfaceCapabilitiesKHR capabilities;
  VkSurfaceKHR_T *local_f8;
  VkPhysicalDevice_T *local_f0;
  _Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_e8;
  _Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_c8;
  VkSurfaceCapabilitiesKHR local_ac;
  SurfaceSupportDetails local_78;
  
  if (in_RDX == 0) {
    (in_RDI->field_0).m_value.capabilities.minImageCount = 0;
    *(undefined ***)((long)&in_RDI->field_0 + 8) = &surface_support_error_category;
    (in_RDI->field_0).m_value.capabilities.minImageExtent.width = 0;
LAB_0012e1ba:
    in_RDI->m_init = false;
    return in_RDI;
  }
  uVar1 = (*(code *)vulkan_functions()::v._232_8_)();
  if (uVar1 != 0) {
    (in_RDI->field_0).m_value.capabilities.minImageCount = 1;
    *(undefined ***)((long)&in_RDI->field_0 + 8) = &surface_support_error_category;
    (in_RDI->field_0).m_value.capabilities.minImageExtent.width = uVar1;
    goto LAB_0012e1ba;
  }
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar2 = get_vector<VkSurfaceFormatKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkSurfaceFormatKHR*),VkPhysicalDevice_T*&,VkSurfaceKHR_T*&>
                    ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)&local_c8,
                     (_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkSurfaceFormatKHR_ptr
                      **)(vulkan_functions()::v + 0xd8),&local_f0,&local_f8);
  if (VVar2 == VK_SUCCESS) {
    VVar2 = get_vector<VkPresentModeKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkPresentModeKHR*),VkPhysicalDevice_T*&,VkSurfaceKHR_T*&>
                      ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)&local_e8,
                       (_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkPresentModeKHR_ptr
                        **)(vulkan_functions()::v + 0xe0),&local_f0,&local_f8);
    if (VVar2 == VK_SUCCESS) {
      local_78.capabilities.supportedUsageFlags = local_ac.supportedUsageFlags;
      local_78.capabilities.maxImageArrayLayers = local_ac.maxImageArrayLayers;
      local_78.capabilities.supportedTransforms = local_ac.supportedTransforms;
      local_78.capabilities.currentTransform = local_ac.currentTransform;
      local_78.capabilities.supportedCompositeAlpha = local_ac.supportedCompositeAlpha;
      local_78.capabilities.minImageExtent = local_ac.minImageExtent;
      local_78.capabilities.maxImageExtent = local_ac.maxImageExtent;
      local_78.capabilities.minImageCount = local_ac.minImageCount;
      local_78.capabilities.maxImageCount = local_ac.maxImageCount;
      local_78.capabilities.currentExtent = local_ac.currentExtent;
      std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
                (&local_78.formats,
                 (vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)&local_c8);
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
                (&local_78.present_modes,
                 (vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)&local_e8);
      Result<vkb::detail::SurfaceSupportDetails>::Result(in_RDI,&local_78);
      SurfaceSupportDetails::~SurfaceSupportDetails(&local_78);
      goto LAB_0012e233;
    }
    (in_RDI->field_0).m_value.capabilities.minImageCount = 3;
  }
  else {
    (in_RDI->field_0).m_value.capabilities.minImageCount = 2;
  }
  *(undefined ***)((long)&in_RDI->field_0 + 8) = &surface_support_error_category;
  (in_RDI->field_0).m_error.vk_result = VVar2;
  in_RDI->m_init = false;
LAB_0012e233:
  std::_Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~_Vector_base(&local_e8);
  std::_Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~_Vector_base
            (&local_c8);
  return in_RDI;
}

Assistant:

Result<SurfaceSupportDetails> query_surface_support_details(VkPhysicalDevice phys_device, VkSurfaceKHR surface) {
    if (surface == VK_NULL_HANDLE) return make_error_code(SurfaceSupportError::surface_handle_null);

    VkSurfaceCapabilitiesKHR capabilities;
    VkResult res = detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfaceCapabilitiesKHR(phys_device, surface, &capabilities);
    if (res != VK_SUCCESS) {
        return { make_error_code(SurfaceSupportError::failed_get_surface_capabilities), res };
    }

    std::vector<VkSurfaceFormatKHR> formats;
    std::vector<VkPresentModeKHR> present_modes;

    auto formats_ret = detail::get_vector<VkSurfaceFormatKHR>(
        formats, detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfaceFormatsKHR, phys_device, surface);
    if (formats_ret != VK_SUCCESS)
        return { make_error_code(SurfaceSupportError::failed_enumerate_surface_formats), formats_ret };
    auto present_modes_ret = detail::get_vector<VkPresentModeKHR>(
        present_modes, detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfacePresentModesKHR, phys_device, surface);
    if (present_modes_ret != VK_SUCCESS)
        return { make_error_code(SurfaceSupportError::failed_enumerate_present_modes), present_modes_ret };

    return SurfaceSupportDetails{ capabilities, formats, present_modes };
}